

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBalance.c
# Opt level: O2

int Abc_NtkBalanceLevel_rec(Abc_Obj_t *pNode)

{
  Abc_Obj_t *p;
  uint uVar1;
  void *pvVar2;
  int i;
  uint uVar3;
  
  if (((ulong)pNode & 1) != 0) {
    __assert_fail("!Abc_ObjIsComplement(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcBalance.c"
                  ,0x22f,"int Abc_NtkBalanceLevel_rec(Abc_Obj_t *)");
  }
  uVar3 = *(uint *)&pNode->field_0x14;
  if (uVar3 < 0x1000) {
    uVar1 = 0;
    if (((uVar3 & 0xf) != 2) && (uVar1 = 0, (uVar3 & 0xf) != 5)) {
      p = (pNode->field_6).pCopy;
      if (p == (Abc_Obj_t *)0x0) {
        __assert_fail("vSuper != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcBalance.c"
                      ,0x235,"int Abc_NtkBalanceLevel_rec(Abc_Obj_t *)");
      }
      uVar3 = 0;
      for (i = 0; i < *(int *)((long)&p->pNtk + 4); i = i + 1) {
        pvVar2 = Vec_PtrEntry((Vec_Ptr_t *)p,i);
        Abc_NtkBalanceLevel_rec((Abc_Obj_t *)((ulong)pvVar2 & 0xfffffffffffffffe));
        uVar1 = *(uint *)&((Abc_Obj_t *)((ulong)pvVar2 & 0xfffffffffffffffe))->field_0x14 >> 0xc;
        if (uVar3 <= uVar1) {
          uVar3 = uVar1;
        }
      }
      *(uint *)&pNode->field_0x14 = (*(uint *)&pNode->field_0x14 & 0xfff) + uVar3 * 0x1000 + 0x1000;
      uVar1 = uVar3 * 0x1000 + 0x1000 >> 0xc;
    }
  }
  else {
    uVar1 = uVar3 >> 0xc;
  }
  return uVar1;
}

Assistant:

int Abc_NtkBalanceLevel_rec( Abc_Obj_t * pNode )
{
    Vec_Ptr_t * vSuper;
    Abc_Obj_t * pFanin;
    int i, LevelMax;
    assert( !Abc_ObjIsComplement(pNode) );
    if ( pNode->Level > 0 )
        return pNode->Level;
    if ( Abc_ObjIsCi(pNode) )
        return 0;
    vSuper = (Vec_Ptr_t *)pNode->pCopy;
    assert( vSuper != NULL );
    LevelMax = 0;
    Vec_PtrForEachEntry( Abc_Obj_t *, vSuper, pFanin, i )
    {
        pFanin = Abc_ObjRegular(pFanin);
        Abc_NtkBalanceLevel_rec(pFanin);
        if ( LevelMax < (int)pFanin->Level )
            LevelMax = pFanin->Level;
    }
    pNode->Level = LevelMax + 1;
    return pNode->Level;
}